

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
__thiscall
wabt::MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
          (wabt *this,Location *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *loc;
  ElemSegmentModuleField *this_00;
  string_view local_30;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  Location *args_local;
  
  local_20 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (Location *)this;
  this_00 = (ElemSegmentModuleField *)operator_new(0xe8);
  loc = args_local_1;
  string_view::string_view(&local_30,local_20);
  ElemSegmentModuleField::ElemSegmentModuleField(this_00,(Location *)loc,local_30);
  std::unique_ptr<wabt::ElemSegmentModuleField,std::default_delete<wabt::ElemSegmentModuleField>>::
  unique_ptr<std::default_delete<wabt::ElemSegmentModuleField>,void>
            ((unique_ptr<wabt::ElemSegmentModuleField,std::default_delete<wabt::ElemSegmentModuleField>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}